

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O0

void __thiscall OpenMD::HBondRvol::process(HBondRvol *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SnapshotManager *this_00;
  Snapshot *pSVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  Vector3d *pVVar7;
  double dVar8;
  double dVar9;
  int binNo_1;
  int binNo;
  Vector3d mPos;
  int istep;
  int nFrames;
  DumpReader reader;
  int nD;
  int nA;
  int nHB;
  int jj;
  int ii;
  RealType ctheta;
  RealType theta;
  RealType DHdist;
  RealType DAdist;
  Vector3d DA;
  Vector3d DH;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Atom *hba2;
  Atom *hba1;
  RealType r;
  iterator hbaj;
  iterator hbai;
  iterator hbdj;
  iterator hbdi;
  HBondDonor *hbd2;
  HBondDonor *hbd1;
  Molecule *mol3;
  Molecule *mol2;
  Molecule *mol1;
  DumpReader *in_stack_ffffffffffffea28;
  DumpReader *in_stack_ffffffffffffea30;
  Atom *in_stack_ffffffffffffea38;
  SelectionEvaluator *in_stack_ffffffffffffea40;
  iterator *in_stack_ffffffffffffea48;
  Molecule *in_stack_ffffffffffffea50;
  SelectionEvaluator *in_stack_ffffffffffffea68;
  Molecule *in_stack_ffffffffffffea88;
  Vector3d *in_stack_ffffffffffffeaa8;
  DumpReader *in_stack_ffffffffffffeab8;
  DumpReader *in_stack_ffffffffffffeac0;
  int local_1388;
  string *in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec88;
  undefined4 in_stack_ffffffffffffec8c;
  DumpReader *in_stack_ffffffffffffec90;
  HBondRvol *in_stack_ffffffffffffff80;
  Atom *local_68;
  Atom *local_60;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_38;
  SelectionEvaluator *local_30;
  Snapshot *local_28;
  DumpReader *local_18;
  DumpReader *local_10;
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_50);
  Vector3<double>::Vector3((Vector3<double> *)0x16fa20);
  Vector3<double>::Vector3((Vector3<double> *)0x16fa2d);
  Vector3<double>::Vector3((Vector3<double> *)0x16fa3a);
  Vector3<double>::Vector3((Vector3<double> *)0x16fa47);
  Vector3<double>::Vector3((Vector3<double> *)0x16fa54);
  DumpReader::DumpReader
            (in_stack_ffffffffffffec90,
             (SimInfo *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),
             in_stack_ffffffffffffec80);
  iVar2 = DumpReader::getNFrames(in_stack_ffffffffffffea30);
  *(undefined4 *)(in_RDI + 0x13a0) = 0;
  for (local_1388 = 0; local_1388 < iVar2; local_1388 = *(int *)(in_RDI + 0x30) + local_1388) {
    DumpReader::readFrame(in_stack_ffffffffffffeac0,(int)((ulong)in_stack_ffffffffffffeab8 >> 0x20))
    ;
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar4 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar4;
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1b8));
    if (bVar1) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea68);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffea40,
                 (SelectionSet *)in_stack_ffffffffffffea38);
      SelectionSet::~SelectionSet((SelectionSet *)0x16fba5);
    }
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x7f0));
    if (bVar1) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea68);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffea40,
                 (SelectionSet *)in_stack_ffffffffffffea38);
      SelectionSet::~SelectionSet((SelectionSet *)0x16fc63);
    }
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xe28));
    if (bVar1) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea68);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffea40,
                 (SelectionSet *)in_stack_ffffffffffffea38);
      SelectionSet::~SelectionSet((SelectionSet *)0x16fd08);
    }
    in_stack_ffffffffffffeac0 =
         (DumpReader *)
         SelectionManager::beginSelectedMolecule
                   ((SelectionManager *)in_stack_ffffffffffffea40,(int *)in_stack_ffffffffffffea38);
    local_10 = in_stack_ffffffffffffeac0;
    while (local_10 != (DumpReader *)0x0) {
      Molecule::getCom(in_stack_ffffffffffffea88);
      in_stack_ffffffffffffeab8 =
           (DumpReader *)
           SelectionManager::beginSelectedMolecule
                     ((SelectionManager *)in_stack_ffffffffffffea40,(int *)in_stack_ffffffffffffea38
                     );
      local_18 = in_stack_ffffffffffffeab8;
      while (local_18 != (DumpReader *)0x0) {
        pSVar4 = (Snapshot *)
                 Molecule::beginHBondDonor
                           (in_stack_ffffffffffffea50,(iterator *)in_stack_ffffffffffffea48);
        local_28 = pSVar4;
        while (local_28 != (Snapshot *)0x0) {
          StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea30,
                     (Vector3<double> *)in_stack_ffffffffffffea28);
          StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea30,
                     (Vector3<double> *)in_stack_ffffffffffffea28);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea38,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea30);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea38,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea30);
          Snapshot::wrapVector(pSVar4,in_stack_ffffffffffffeaa8);
          pVVar7 = (Vector3d *)Vector<double,_3U>::length((Vector<double,_3U> *)0x16fef4);
          in_stack_ffffffffffffeaa8 = pVVar7;
          local_68 = Molecule::beginHBondAcceptor
                               (in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
          while (local_68 != (Atom *)0x0) {
            StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea30,
                       (Vector3<double> *)in_stack_ffffffffffffea28);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea38,
                              (Vector<double,_3U> *)in_stack_ffffffffffffea30);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea38,
                       (Vector<double,_3U> *)in_stack_ffffffffffffea30);
            Snapshot::wrapVector(pSVar4,in_stack_ffffffffffffeaa8);
            dVar8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x16ffd8);
            if (dVar8 < *(double *)(in_RDI + 5000)) {
              dVar9 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffea40,
                                     (Vector<double,_3U> *)in_stack_ffffffffffffea38);
              dVar8 = acos(dVar9 / ((double)pVVar7 * dVar8));
              if ((dVar8 * 180.0) / 3.141592653589793 < *(double *)(in_RDI + 0x1398)) {
                in_stack_ffffffffffffea88 =
                     (Molecule *)Vector<double,_3U>::length((Vector<double,_3U> *)0x1700d3);
                iVar3 = (int)((double)in_stack_ffffffffffffea88 / *(double *)(in_RDI + 0x1390));
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13a8),
                                    (long)iVar3);
                *pvVar5 = *pvVar5 + 1.0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13c0),
                                    (long)iVar3);
                *pvVar6 = *pvVar6 + 1;
              }
            }
            local_68 = Molecule::nextHBondAcceptor
                                 (in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
          }
          local_28 = (Snapshot *)
                     Molecule::nextHBondDonor
                               (in_stack_ffffffffffffea50,(iterator *)in_stack_ffffffffffffea48);
        }
        local_60 = Molecule::beginHBondAcceptor(in_stack_ffffffffffffea50,in_stack_ffffffffffffea48)
        ;
        while (local_60 != (Atom *)0x0) {
          StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea30,
                     (Vector3<double> *)in_stack_ffffffffffffea28);
          in_stack_ffffffffffffea68 =
               (SelectionEvaluator *)
               Molecule::beginHBondDonor
                         (in_stack_ffffffffffffea50,(iterator *)in_stack_ffffffffffffea48);
          local_30 = in_stack_ffffffffffffea68;
          while (local_30 != (SelectionEvaluator *)0x0) {
            StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea30,
                       (Vector3<double> *)in_stack_ffffffffffffea28);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea38,
                              (Vector<double,_3U> *)in_stack_ffffffffffffea30);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea38,
                       (Vector<double,_3U> *)in_stack_ffffffffffffea30);
            Snapshot::wrapVector(pSVar4,in_stack_ffffffffffffeaa8);
            dVar8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1702e7);
            if (dVar8 < *(double *)(in_RDI + 5000)) {
              StuntDouble::getPos(&in_stack_ffffffffffffea38->super_StuntDouble);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffea30,
                         (Vector3<double> *)in_stack_ffffffffffffea28);
              OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea38,
                                (Vector<double,_3U> *)in_stack_ffffffffffffea30);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffea38,
                         (Vector<double,_3U> *)in_stack_ffffffffffffea30);
              Snapshot::wrapVector(pSVar4,in_stack_ffffffffffffeaa8);
              dVar9 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1703b4);
              in_stack_ffffffffffffea50 =
                   (Molecule *)
                   dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffea40,
                                  (Vector<double,_3U> *)in_stack_ffffffffffffea38);
              dVar8 = acos((double)in_stack_ffffffffffffea50 / (dVar9 * dVar8));
              if ((dVar8 * 180.0) / 3.141592653589793 < *(double *)(in_RDI + 0x1398)) {
                in_stack_ffffffffffffea48 =
                     (iterator *)Vector<double,_3U>::length((Vector<double,_3U> *)0x17048c);
                iVar3 = (int)((double)in_stack_ffffffffffffea48 / *(double *)(in_RDI + 0x1390));
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13a8),
                                    (long)iVar3);
                *pvVar5 = *pvVar5 + 1.0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13c0),
                                    (long)iVar3);
                *pvVar6 = *pvVar6 + 1;
              }
            }
            in_stack_ffffffffffffea40 =
                 (SelectionEvaluator *)
                 Molecule::nextHBondDonor
                           (in_stack_ffffffffffffea50,(iterator *)in_stack_ffffffffffffea48);
            local_30 = in_stack_ffffffffffffea40;
          }
          in_stack_ffffffffffffea38 =
               Molecule::nextHBondAcceptor(in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
          local_60 = in_stack_ffffffffffffea38;
        }
        in_stack_ffffffffffffea30 =
             (DumpReader *)
             SelectionManager::nextSelectedMolecule
                       ((SelectionManager *)in_stack_ffffffffffffea40,
                        (int *)in_stack_ffffffffffffea38);
        local_18 = in_stack_ffffffffffffea30;
      }
      in_stack_ffffffffffffea28 =
           (DumpReader *)
           SelectionManager::nextSelectedMolecule
                     ((SelectionManager *)in_stack_ffffffffffffea40,(int *)in_stack_ffffffffffffea38
                     );
      local_10 = in_stack_ffffffffffffea28;
    }
    writeDensityR(in_stack_ffffffffffffff80);
  }
  DumpReader::~DumpReader(in_stack_ffffffffffffea30);
  return;
}

Assistant:

void HBondRvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* mol3;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;

    RealType r;

    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
      writeDensityR();
    }
  }